

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

void WriteVarLen(TArray<unsigned_char,_unsigned_char> *file,DWORD value)

{
  uint uVar1;
  ulong uVar2;
  uchar uVar3;
  bool bVar4;
  
  uVar1 = value & 0x7f;
  if (0x7f < value) {
    uVar2 = (ulong)value;
    do {
      uVar2 = uVar2 >> 7;
      uVar1 = (uint)uVar2 & 0xff | uVar1 << 8 | 0x80;
      bVar4 = 0x3fff < value;
      value = (uint)uVar2;
    } while (bVar4);
  }
  uVar2 = (ulong)uVar1;
  do {
    TArray<unsigned_char,_unsigned_char>::Grow(file,1);
    uVar3 = (uchar)uVar1;
    file->Array[file->Count] = uVar3;
    file->Count = file->Count + 1;
    uVar1 = (uint)(uVar2 >> 8);
    uVar2 = uVar2 >> 8;
  } while ((char)uVar3 < '\0');
  return;
}

Assistant:

static void WriteVarLen (TArray<BYTE> &file, DWORD value)
{
   DWORD buffer = value & 0x7F;

   while ( (value >>= 7) )
   {
     buffer <<= 8;
     buffer |= (value & 0x7F) | 0x80;
   }

   for (;;)
   {
	   file.Push(BYTE(buffer));
	   if (buffer & 0x80)
	   {
		   buffer >>= 8;
	   }
	   else
	   {
		   break;
	   }
   }
}